

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::Matrix<int,2,1,0,2,1>,Eigen::internal::assign_op<int,int>>
               (Matrix<int,__1,_1,_0,__1,_1> *dst,Matrix<int,_2,_1,_0,_2,_1> *src,
               assign_op<int,_int> *func)

{
  SrcEvaluatorType func_00;
  Matrix<int,__1,_1,_0,__1,_1> *dstExpr;
  undefined1 local_60 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_> local_28;
  SrcEvaluatorType srcEvaluator;
  assign_op<int,_int> *func_local;
  Matrix<int,_2,_1,_0,_2,_1> *src_local;
  Matrix<int,__1,_1,_0,__1,_1> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>_>.m_d.data
       = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>_>)func;
  evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::Matrix<int,2,1,0,2,1>,int,int>
            (dst,src,(assign_op<int,_int> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>_>.
                     m_d.data);
  evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>
              *)local_60,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (assign_op<int,_int> *)
             func_00.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>_>.
             m_d.data,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>,_Eigen::internal::assign_op<int,_int>,_0>
         *)local_60);
  evaluator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Matrix<int,_2,_1,_0,_2,_1>_>::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}